

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

BigInt * extended_gcd(BigInt *__return_storage_ptr__,BigInt *a,BigInt *b,BigInt *x,BigInt *y)

{
  bool bVar1;
  BigInt local_70;
  BigInt local_50;
  
  BigInt::BigInt(&local_70,0);
  bVar1 = BigInt::operator==(b,&local_70);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_70);
  if (bVar1) {
    BigInt::operator=(x,1);
    BigInt::operator=(y,0);
    BigInt::BigInt(__return_storage_ptr__,a);
  }
  else {
    BigInt::operator%(&local_70,a,b);
    extended_gcd(__return_storage_ptr__,b,&local_70,y,x);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_70);
    BigInt::operator/(&local_50,a,b);
    BigInt::operator*(&local_70,&local_50,x);
    BigInt::operator-=(y,&local_70);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_70);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt extended_gcd(const BigInt &a, const BigInt &b, BigInt &x, BigInt &y) {
    if (b == BigInt(0)) //!check on b for the zero division
    {
        x = 1, y = 0; //! a*1 + b *0 = gcd(a,0) =  a
        return a;
    }

    BigInt g = extended_gcd(b, a % b, y, x); //! b, a % b order for infinite loops
    y -= (a / b) * x;//!Ynew= Xold - (a/b) * Yold , Xnew=Yold
    return g;
}